

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextElementTable.h
# Opt level: O3

ImaginaryFloatingConstant * __thiscall
psy::TextElementTable<psy::C::ImaginaryFloatingConstant>::find
          (TextElementTable<psy::C::ImaginaryFloatingConstant> *this,char *chars,uint size)

{
  int iVar1;
  ulong uVar2;
  ImaginaryFloatingConstant *pIVar3;
  
  if (this->buckets_ != (ImaginaryFloatingConstant **)0x0) {
    uVar2 = psy::TextElement::hashCode(chars,size);
    pIVar3 = this->buckets_[(uVar2 & 0xffffffff) % (ulong)(uint)this->bucketCount_];
    if (pIVar3 != (ImaginaryFloatingConstant *)0x0) {
      do {
        if ((*(uint *)&(pIVar3->super_Lexeme).field_0x8 == size) &&
           (iVar1 = strncmp(*(char **)&(pIVar3->super_Lexeme).field_0x10,chars,(ulong)size),
           iVar1 == 0)) {
          return pIVar3;
        }
        pIVar3 = *(ImaginaryFloatingConstant **)&(pIVar3->super_Lexeme).field_0x20;
      } while (pIVar3 != (ImaginaryFloatingConstant *)0x0);
    }
  }
  return (ImaginaryFloatingConstant *)0x0;
}

Assistant:

const ElemT* find(const char* chars, unsigned int size) const
    {
        if (buckets_) {
            unsigned int h = ElemT::hashCode(chars, size);
            ElemT* elem = buckets_[h % bucketCount_];
            for (; elem; elem = static_cast<ElemT*>(elem->next_)) {
                if (elem->size() == size && !std::strncmp(elem->c_str(), chars, size))
                    return elem;
            }
        }
        return nullptr;
    }